

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeGenerator.cpp
# Opt level: O0

EmitExpressionInfo __thiscall
Js::AsmJSByteCodeGenerator::EmitMinMax
          (AsmJSByteCodeGenerator *this,ParseNode *pnode,AsmJsMathFunction *mathFunction)

{
  ushort inArgCount;
  RegSlot R1;
  ParseNode *node;
  AsmJsFunc *pAVar1;
  code *pcVar2;
  EmitExpressionInfo EVar3;
  uint uVar4;
  OpCodeAsmJs op_00;
  RegSlot R0;
  bool bVar5;
  ArgSlot AVar6;
  undefined4 *puVar7;
  ParseNodeCall *pPVar8;
  AsmJsCompilationException *pAVar9;
  Memory *pMVar10;
  AsmJsType *pAVar11;
  EmitExpressionInfo *pEVar12;
  ParseNode *pnode_00;
  EmitExpressionInfo EVar13;
  ulong uVar14;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar15 [16];
  AsmJsType local_11c;
  AsmJsType local_118;
  uint local_114;
  AsmJsType local_110;
  uint j;
  Which local_108;
  int local_104;
  int local_100;
  int runtimeArg;
  int argByteSize;
  bool supported;
  OpCodeAsmJs op;
  EmitExpressionInfo EStack_f4;
  AsmJsRetType retType;
  int local_ec;
  int i;
  ParseNode *local_e0;
  ParseNode *arg;
  TrackAllocData local_c8;
  code *local_a0;
  undefined8 local_98;
  TrackAllocData local_90;
  undefined1 local_68 [8];
  AutoArrayPtr<Js::EmitExpressionInfo> argsInfo;
  AutoArrayPtr<Js::AsmJsType> types;
  ParseNode *local_38;
  ParseNode *argNode;
  uint16 argCount;
  AsmJsMathFunction *mathFunction_local;
  ParseNode *pnode_local;
  AsmJSByteCodeGenerator *this_local;
  EmitExpressionInfo dstInfo;
  
  AVar6 = AsmJsFunctionDeclaration::GetArgCount(&mathFunction->super_AsmJsFunctionDeclaration);
  if (AVar6 != 2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsByteCodeGenerator.cpp"
                                ,0x519,"(mathFunction->GetArgCount() == 2)",
                                "mathFunction->GetArgCount() == 2");
    if (!bVar5) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  pPVar8 = ParseNode::AsParseNodeCall(pnode);
  inArgCount = pPVar8->argCount;
  pPVar8 = ParseNode::AsParseNodeCall(pnode);
  node = pPVar8->pnodeArgs;
  if (1 < inArgCount) {
    AutoArrayPtr<Js::AsmJsType>::AutoArrayPtr
              ((AutoArrayPtr<Js::AsmJsType> *)&argsInfo.m_elementCount,(AsmJsType *)0x0,0);
    AutoArrayPtr<Js::EmitExpressionInfo>::AutoArrayPtr
              ((AutoArrayPtr<Js::EmitExpressionInfo> *)local_68,(EmitExpressionInfo *)0x0,0);
    AVar6 = AsmJsFunctionDeclaration::GetArgCount(&mathFunction->super_AsmJsFunctionDeclaration);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_90,(type_info *)&AsmJsType::typeinfo,0,(ulong)AVar6,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsByteCodeGenerator.cpp"
               ,0x524);
    pMVar10 = (Memory *)
              Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_90);
    AVar6 = AsmJsFunctionDeclaration::GetArgCount(&mathFunction->super_AsmJsFunctionDeclaration);
    local_a0 = Memory::HeapAllocator::Alloc;
    local_98 = 0;
    pAVar11 = Memory::AllocateArray<Memory::HeapAllocator,Js::AsmJsType,false>
                        (pMVar10,(HeapAllocator *)Memory::HeapAllocator::Alloc,0,(ulong)AVar6);
    AVar6 = AsmJsFunctionDeclaration::GetArgCount(&mathFunction->super_AsmJsFunctionDeclaration);
    AutoArrayPtr<Js::AsmJsType>::Set
              ((AutoArrayPtr<Js::AsmJsType> *)&argsInfo.m_elementCount,pAVar11,(uint)AVar6);
    AVar6 = AsmJsFunctionDeclaration::GetArgCount(&mathFunction->super_AsmJsFunctionDeclaration);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_c8,(type_info *)&EmitExpressionInfo::typeinfo,0,(ulong)AVar6,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsByteCodeGenerator.cpp"
               ,0x525);
    pMVar10 = (Memory *)
              Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_c8);
    AVar6 = AsmJsFunctionDeclaration::GetArgCount(&mathFunction->super_AsmJsFunctionDeclaration);
    pEVar12 = Memory::AllocateArray<Memory::HeapAllocator,Js::EmitExpressionInfo,false>
                        (pMVar10,(HeapAllocator *)Memory::HeapAllocator::Alloc,0,(ulong)AVar6);
    AVar6 = AsmJsFunctionDeclaration::GetArgCount(&mathFunction->super_AsmJsFunctionDeclaration);
    AutoArrayPtr<Js::EmitExpressionInfo>::Set
              ((AutoArrayPtr<Js::EmitExpressionInfo> *)local_68,pEVar12,(uint)AVar6);
    pnode_00 = ParserWrapper::GetBinaryLeft(node);
    local_38 = ParserWrapper::GetBinaryRight(node);
    EVar13 = Emit(this,pnode_00);
    pEVar12 = BasePtr::operator_cast_to_EmitExpressionInfo_((BasePtr *)local_68);
    *pEVar12 = EVar13;
    pEVar12 = BasePtr::operator_cast_to_EmitExpressionInfo_((BasePtr *)local_68);
    pAVar11 = BasePtr::operator_cast_to_AsmJsType_((BasePtr *)&argsInfo.m_elementCount);
    pAVar11->which_ = (pEVar12->type).which_;
    EmitExpressionInfo::EmitExpressionInfo((EmitExpressionInfo *)&this_local);
    local_ec = 1;
    while( true ) {
      if ((int)(uint)inArgCount <= local_ec) {
        AutoArrayPtr<Js::EmitExpressionInfo>::~AutoArrayPtr
                  ((AutoArrayPtr<Js::EmitExpressionInfo> *)local_68);
        AutoArrayPtr<Js::AsmJsType>::~AutoArrayPtr
                  ((AutoArrayPtr<Js::AsmJsType> *)&argsInfo.m_elementCount);
        EVar13.type.which_ = this_local._4_4_;
        EVar13.super_EmitInfoBase.location = this_local._0_4_;
        return EVar13;
      }
      if (local_38->nop == knopList) {
        local_e0 = ParserWrapper::GetBinaryLeft(local_38);
        local_38 = ParserWrapper::GetBinaryRight(local_38);
      }
      else {
        local_e0 = local_38;
      }
      EStack_f4 = Emit(this,local_e0);
      pEVar12 = BasePtr::operator_cast_to_EmitExpressionInfo_((BasePtr *)local_68);
      pEVar12[1] = EStack_f4;
      pEVar12 = BasePtr::operator_cast_to_EmitExpressionInfo_((BasePtr *)local_68);
      pAVar11 = BasePtr::operator_cast_to_AsmJsType_((BasePtr *)&argsInfo.m_elementCount);
      pAVar11[1].which_ = pEVar12[1].type.which_;
      AsmJsRetType::AsmJsRetType((AsmJsRetType *)&argByteSize);
      AVar6 = AsmJsFunctionDeclaration::GetArgCount(&mathFunction->super_AsmJsFunctionDeclaration);
      pAVar11 = BasePtr::operator_cast_to_AsmJsType_((BasePtr *)&argsInfo.m_elementCount);
      runtimeArg._1_1_ =
           AsmJsMathFunction::SupportsMathCall
                     (mathFunction,AVar6,pAVar11,(OpCodeAsmJs *)((long)&runtimeArg + 2),
                      (AsmJsRetType *)&argByteSize);
      if (!(bool)runtimeArg._1_1_) break;
      AVar6 = AsmJsFunctionDeclaration::GetArgByteSize
                        (&mathFunction->super_AsmJsFunctionDeclaration,inArgCount);
      local_100 = AVar6 + 8;
      auVar15._0_8_ = (double)((ulong)(long)local_100 >> 3);
      auVar15._8_8_ = extraout_XMM0_Qb;
      auVar15 = roundsd(auVar15,auVar15,10);
      local_104 = (int)auVar15._0_8_ + 1;
      AsmJsFunc::UpdateMaxArgOutDepth(this->mFunction,(int)auVar15._0_8_ + 2);
      pAVar1 = this->mFunction;
      pEVar12 = BasePtr::operator_cast_to_EmitExpressionInfo_((BasePtr *)local_68);
      AsmJsFunc::ReleaseLocationGeneric(pAVar1,pEVar12 + 1);
      pAVar1 = this->mFunction;
      pEVar12 = BasePtr::operator_cast_to_EmitExpressionInfo_((BasePtr *)local_68);
      AsmJsFunc::ReleaseLocationGeneric(pAVar1,pEVar12);
      local_108 = (Which)AsmJsRetType::toType((AsmJsRetType *)&argByteSize);
      this_local._4_4_ = (AsmJsType)local_108;
      j = (uint)AsmJsRetType::toType((AsmJsRetType *)&argByteSize);
      bVar5 = AsmJsType::isSigned((AsmJsType *)&j);
      if (bVar5) {
        this_local._0_4_ = AsmJsFunc::AcquireTmpRegister<int>(this->mFunction);
      }
      else {
        local_110 = AsmJsRetType::toType((AsmJsRetType *)&argByteSize);
        bVar5 = AsmJsType::isDouble(&local_110);
        if (((bVar5 ^ 0xffU) & 1) != 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsByteCodeGenerator.cpp"
                                      ,0x557,"(retType.toType().isDouble())",
                                      "retType.toType().isDouble()");
          if (!bVar5) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 0;
        }
        this_local._0_4_ = AsmJsFunc::AcquireTmpRegister<double>(this->mFunction);
      }
      R0 = this_local._0_4_;
      op_00 = runtimeArg._2_2_;
      pEVar12 = BasePtr::operator_cast_to_EmitExpressionInfo_((BasePtr *)local_68);
      R1 = (pEVar12->super_EmitInfoBase).location;
      pEVar12 = BasePtr::operator_cast_to_EmitExpressionInfo_((BasePtr *)local_68);
      AsmJsByteCodeWriter::AsmReg3
                (&this->mWriter,op_00,R0,R1,pEVar12[1].super_EmitInfoBase.location);
      pEVar12 = BasePtr::operator_cast_to_EmitExpressionInfo_((BasePtr *)local_68);
      EVar3.type.which_ = this_local._4_4_;
      EVar3.super_EmitInfoBase.location = this_local._0_4_;
      *pEVar12 = EVar3;
      for (local_114 = 0; uVar4 = local_114,
          AVar6 = AsmJsFunctionDeclaration::GetArgCount
                            (&mathFunction->super_AsmJsFunctionDeclaration), uVar4 < AVar6;
          local_114 = local_114 + 1) {
        pEVar12 = BasePtr::operator_cast_to_EmitExpressionInfo_((BasePtr *)local_68);
        uVar14 = (ulong)local_114;
        AsmJsType::AsmJsType(&local_118,MaybeDouble);
        bVar5 = AsmJsType::isSubType(&pEVar12[uVar14].type,local_118);
        if (bVar5) {
          pAVar1 = this->mFunction;
          pEVar12 = BasePtr::operator_cast_to_EmitExpressionInfo_((BasePtr *)local_68);
          bVar5 = AsmJsFunc::IsValidLocation<double>(pAVar1,pEVar12 + local_114);
          if (!bVar5) {
            pAVar9 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
            pEVar12 = BasePtr::operator_cast_to_EmitExpressionInfo_((BasePtr *)local_68);
            AsmJsCompilationException::AsmJsCompilationException
                      (pAVar9,L"Invalid Node location[%d] ",
                       (ulong)pEVar12[local_114].super_EmitInfoBase.location);
            __cxa_throw(pAVar9,&AsmJsCompilationException::typeinfo,0);
          }
        }
        else {
          pEVar12 = BasePtr::operator_cast_to_EmitExpressionInfo_((BasePtr *)local_68);
          uVar14 = (ulong)local_114;
          AsmJsType::AsmJsType(&local_11c,Intish);
          bVar5 = AsmJsType::isSubType(&pEVar12[uVar14].type,local_11c);
          if (bVar5) {
            pAVar1 = this->mFunction;
            pEVar12 = BasePtr::operator_cast_to_EmitExpressionInfo_((BasePtr *)local_68);
            bVar5 = AsmJsFunc::IsValidLocation<int>(pAVar1,pEVar12 + local_114);
            if (!bVar5) {
              pAVar9 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
              pEVar12 = BasePtr::operator_cast_to_EmitExpressionInfo_((BasePtr *)local_68);
              AsmJsCompilationException::AsmJsCompilationException
                        (pAVar9,L"Invalid Node location[%d] ",
                         (ulong)pEVar12[local_114].super_EmitInfoBase.location);
              __cxa_throw(pAVar9,&AsmJsCompilationException::typeinfo,0);
            }
          }
          else {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 1;
            bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsByteCodeGenerator.cpp"
                                        ,0x56b,"((0))","UNREACHED");
            if (!bVar5) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 0;
          }
        }
      }
      local_ec = local_ec + 1;
    }
    pAVar9 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
    AsmJsCompilationException::AsmJsCompilationException
              (pAVar9,L"Math builtin function doesn\'t support arguments");
    __cxa_throw(pAVar9,&AsmJsCompilationException::typeinfo,0);
  }
  pAVar9 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
  AsmJsCompilationException::AsmJsCompilationException
            (pAVar9,L"Math builtin function doesn\'t support arguments");
  __cxa_throw(pAVar9,&AsmJsCompilationException::typeinfo,0);
}

Assistant:

EmitExpressionInfo AsmJSByteCodeGenerator::EmitMinMax(ParseNode* pnode, AsmJsMathFunction* mathFunction)
    {
        Assert(mathFunction->GetArgCount() == 2);
        uint16 argCount = pnode->AsParseNodeCall()->argCount;
        ParseNode* argNode = pnode->AsParseNodeCall()->pnodeArgs;

        if (argCount < 2)
        {
            throw AsmJsCompilationException(_u("Math builtin function doesn't support arguments"));
        }

        AutoArrayPtr<AsmJsType> types(nullptr, 0);
        AutoArrayPtr<EmitExpressionInfo> argsInfo(nullptr, 0);
        types.Set(HeapNewArray(AsmJsType, mathFunction->GetArgCount()), mathFunction->GetArgCount());
        argsInfo.Set(HeapNewArray(EmitExpressionInfo, mathFunction->GetArgCount()), mathFunction->GetArgCount());

        ParseNode * arg = ParserWrapper::GetBinaryLeft(argNode);
        argNode = ParserWrapper::GetBinaryRight(argNode);
        // Emit first arg as arg0
        argsInfo[0] = Emit(arg);
        types[0] = argsInfo[0].type;

        EmitExpressionInfo dstInfo;
        for (int i = 1; i < argCount; i++)
        {
            if (argNode->nop == knopList)
            {
                arg = ParserWrapper::GetBinaryLeft(argNode);
                argNode = ParserWrapper::GetBinaryRight(argNode);
            }
            else
            {
                arg = argNode;
            }
            // arg1 will always be the next arg in the argList
            argsInfo[1] = Emit(arg);
            types[1] = argsInfo[1].type;

            // Check if this function supports the type of these arguments
            AsmJsRetType retType;
            OpCodeAsmJs op;
            const bool supported = mathFunction->SupportsMathCall(mathFunction->GetArgCount(), types, op, retType);
            if (!supported)
            {
                throw AsmJsCompilationException(_u("Math builtin function doesn't support arguments"));
            }

            const int argByteSize = mathFunction->GetArgByteSize(argCount) + sizeof(Var);
            // +1 is for function object
            int runtimeArg = (int)(::ceil((double)(argByteSize / sizeof(Var)))) + 1;
            // +1 is for return address

            // Make sure we have enough memory allocated for OutParameters
            mFunction->UpdateMaxArgOutDepth(runtimeArg + 1);
            mFunction->ReleaseLocationGeneric(&argsInfo[1]);
            mFunction->ReleaseLocationGeneric(&argsInfo[0]);

            dstInfo.type = retType.toType();
            if (retType.toType().isSigned())
            {
                dstInfo.location = mFunction->AcquireTmpRegister<int>();
            }
            else
            {
                Assert(retType.toType().isDouble());
                dstInfo.location = mFunction->AcquireTmpRegister<double>();
            }

            mWriter.AsmReg3(op, dstInfo.location, argsInfo[0].location, argsInfo[1].location);
            // for max/min calls with more than 2 arguments, we use the result of previous call for arg0
            argsInfo[0] = dstInfo;
#if DBG
            for (uint j = 0; j < mathFunction->GetArgCount(); j++)
            {
                if (argsInfo[j].type.isSubType(AsmJsType::MaybeDouble))
                {
                    CheckNodeLocation(argsInfo[j], double);
                }
                else if (argsInfo[j].type.isSubType(AsmJsType::Intish))
                {
                    CheckNodeLocation(argsInfo[j], int);
                }
                else
                {
                    Assert(UNREACHED);
                }
            }
#endif
        }
        return dstInfo;
    }